

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O0

int g_read(lua_State *L,FILE *f,int first)

{
  int iVar1;
  size_t n_00;
  int local_48;
  char *local_40;
  char *p;
  size_t l;
  int n;
  int success;
  int nargs;
  int first_local;
  FILE *f_local;
  lua_State *L_local;
  
  iVar1 = lua_gettop(L);
  clearerr((FILE *)f);
  if (iVar1 + -1 == 0) {
    l._4_4_ = read_line(L,f,1);
    l._0_4_ = first + 1;
  }
  else {
    luaL_checkstack(L,iVar1 + 0x13,"too many arguments");
    l._4_4_ = 1;
    l._0_4_ = first;
    n = iVar1 + -1;
    while (n != 0 && l._4_4_ != 0) {
      iVar1 = lua_type(L,(int)l);
      if (iVar1 == 3) {
        n_00 = luaL_checkinteger(L,(int)l);
        if (n_00 == 0) {
          local_48 = test_eof(L,f);
        }
        else {
          local_48 = read_chars(L,f,n_00);
        }
        l._4_4_ = local_48;
      }
      else {
        local_40 = luaL_checklstring(L,(int)l,(size_t *)0x0);
        if (*local_40 == '*') {
          local_40 = local_40 + 1;
        }
        switch(*local_40) {
        case 'L':
          l._4_4_ = read_line(L,f,0);
          break;
        default:
          iVar1 = luaL_argerror(L,(int)l,"invalid format");
          return iVar1;
        case 'a':
          read_all(L,f);
          l._4_4_ = 1;
          break;
        case 'l':
          l._4_4_ = read_line(L,f,1);
          break;
        case 'n':
          l._4_4_ = read_number(L,f);
        }
      }
      l._0_4_ = (int)l + 1;
      n = n + -1;
    }
  }
  iVar1 = ferror((FILE *)f);
  if (iVar1 == 0) {
    if (l._4_4_ == 0) {
      lua_settop(L,-2);
      lua_pushnil(L);
    }
    L_local._4_4_ = (int)l - first;
  }
  else {
    L_local._4_4_ = luaL_fileresult(L,0,(char *)0x0);
  }
  return L_local._4_4_;
}

Assistant:

static int g_read (lua_State *L, FILE *f, int first) {
  int nargs = lua_gettop(L) - 1;
  int success;
  int n;
  clearerr(f);
  if (nargs == 0) {  /* no arguments? */
    success = read_line(L, f, 1);
    n = first+1;  /* to return 1 result */
  }
  else {  /* ensure stack space for all results and for auxlib's buffer */
    luaL_checkstack(L, nargs+LUA_MINSTACK, "too many arguments");
    success = 1;
    for (n = first; nargs-- && success; n++) {
      if (lua_type(L, n) == LUA_TNUMBER) {
        size_t l = (size_t)luaL_checkinteger(L, n);
        success = (l == 0) ? test_eof(L, f) : read_chars(L, f, l);
      }
      else {
        const char *p = luaL_checkstring(L, n);
        if (*p == '*') p++;  /* skip optional '*' (for compatibility) */
        switch (*p) {
          case 'n':  /* number */
            success = read_number(L, f);
            break;
          case 'l':  /* line */
            success = read_line(L, f, 1);
            break;
          case 'L':  /* line with end-of-line */
            success = read_line(L, f, 0);
            break;
          case 'a':  /* file */
            read_all(L, f);  /* read entire file */
            success = 1; /* always success */
            break;
          default:
            return luaL_argerror(L, n, "invalid format");
        }
      }
    }
  }
  if (ferror(f))
    return luaL_fileresult(L, 0, NULL);
  if (!success) {
    lua_pop(L, 1);  /* remove last result */
    lua_pushnil(L);  /* push nil instead */
  }
  return n - first;
}